

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O0

void __thiscall basisu::vector<basisu::image>::clear(vector<basisu::image> *this)

{
  long lVar1;
  image *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  lVar1._0_4_ = in_RDI->m_width;
  lVar1._4_4_ = in_RDI->m_height;
  if (lVar1 != 0) {
    scalar_type<basisu::image>::destruct_array(in_RDI,in_stack_ffffffffffffffe8);
    free(*(void **)in_RDI);
    in_RDI->m_width = 0;
    in_RDI->m_height = 0;
    in_RDI->m_pitch = 0;
    *(undefined4 *)&in_RDI->field_0xc = 0;
  }
  return;
}

Assistant:

inline void clear()
      {
         if (m_p)
         {
            scalar_type<T>::destruct_array(m_p, m_size);
            free(m_p);
            m_p = NULL;
            m_size = 0;
            m_capacity = 0;
         }
      }